

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_GenerateKeyPair
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_ATTRIBUTE_PTR pPublicKeyTemplate,CK_ULONG ulPublicKeyAttributeCount,
          CK_ATTRIBUTE_PTR pPrivateKeyTemplate,CK_ULONG ulPrivateKeyAttributeCount,
          CK_OBJECT_HANDLE_PTR phPublicKey,CK_OBJECT_HANDLE_PTR phPrivateKey)

{
  long lVar1;
  CK_STATE sessionState;
  CK_RV CVar2;
  CK_ATTRIBUTE_PTR in_RCX;
  long *in_RDX;
  long in_RDI;
  CK_ULONG in_R8;
  CK_ATTRIBUTE_PTR in_R9;
  CK_ULONG in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  CK_RV rv;
  bool isPrivateKeyImplicit;
  CK_BBOOL isprivateKeyPrivate;
  CK_BBOOL isprivateKeyToken;
  CK_OBJECT_CLASS privateKeyClass;
  bool isPublicKeyImplicit;
  CK_BBOOL ispublicKeyPrivate;
  CK_BBOOL ispublicKeyToken;
  CK_OBJECT_CLASS publicKeyClass;
  CK_CERTIFICATE_TYPE dummy;
  CK_KEY_TYPE keyType;
  Session *session;
  CK_ULONG in_stack_00000e90;
  CK_ATTRIBUTE_PTR in_stack_00000e98;
  CK_ULONG in_stack_00000ea0;
  CK_ATTRIBUTE_PTR in_stack_00000ea8;
  CK_SESSION_HANDLE in_stack_00000eb0;
  SoftHSM *in_stack_00000eb8;
  CK_OBJECT_HANDLE_PTR in_stack_00000ed0;
  CK_OBJECT_HANDLE_PTR in_stack_00000ed8;
  CK_BBOOL in_stack_00000ee0;
  CK_BBOOL in_stack_00000ee8;
  CK_BBOOL in_stack_00000ef0;
  CK_BBOOL in_stack_00000ef8;
  CK_ULONG in_stack_000010f0;
  CK_ATTRIBUTE_PTR in_stack_000010f8;
  CK_ULONG in_stack_00001100;
  CK_ATTRIBUTE_PTR in_stack_00001108;
  CK_SESSION_HANDLE in_stack_00001110;
  SoftHSM *in_stack_00001118;
  CK_SESSION_HANDLE in_stack_00001120;
  SoftHSM *in_stack_00001128;
  CK_OBJECT_HANDLE_PTR in_stack_00001130;
  CK_OBJECT_HANDLE_PTR in_stack_00001138;
  CK_BBOOL in_stack_00001140;
  undefined7 in_stack_00001141;
  CK_BBOOL in_stack_00001148;
  undefined7 in_stack_00001149;
  CK_BBOOL in_stack_00001150;
  CK_BBOOL in_stack_00001158;
  CK_BBOOL in_stack_00001160;
  CK_BBOOL in_stack_00001168;
  CK_ULONG in_stack_00001180;
  CK_ATTRIBUTE_PTR in_stack_00001188;
  CK_ULONG in_stack_00001190;
  CK_ATTRIBUTE_PTR in_stack_00001198;
  CK_SESSION_HANDLE in_stack_000011a0;
  SoftHSM *in_stack_000011a8;
  CK_OBJECT_HANDLE_PTR in_stack_000011c0;
  CK_OBJECT_HANDLE_PTR in_stack_000011c8;
  CK_BBOOL in_stack_000011d0;
  CK_BBOOL in_stack_000011d8;
  CK_BBOOL in_stack_000011e0;
  CK_BBOOL in_stack_000011e8;
  CK_ULONG in_stack_00001560;
  CK_ATTRIBUTE_PTR in_stack_00001568;
  CK_ULONG in_stack_00001570;
  CK_ATTRIBUTE_PTR in_stack_00001578;
  CK_SESSION_HANDLE in_stack_00001580;
  SoftHSM *in_stack_00001588;
  CK_OBJECT_HANDLE_PTR in_stack_000015a0;
  CK_OBJECT_HANDLE_PTR in_stack_000015a8;
  CK_BBOOL in_stack_000015b0;
  CK_BBOOL in_stack_000015b8;
  CK_BBOOL in_stack_000015c0;
  CK_BBOOL in_stack_000015c8;
  Session *this_00;
  bool local_a9;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  HandleManager *in_stack_ffffffffffffff68;
  undefined1 local_7a [50];
  CK_ATTRIBUTE_PTR local_48;
  CK_ULONG local_40;
  CK_ATTRIBUTE_PTR local_38;
  long *local_30;
  CK_RV local_18;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_18 = 400;
  }
  else if (in_RDX == (long *)0x0) {
    local_18 = 7;
  }
  else if ((in_RCX == (CK_ATTRIBUTE_PTR)0x0) && (in_R8 != 0)) {
    local_18 = 7;
  }
  else if ((in_R9 == (CK_ATTRIBUTE_PTR)0x0) && (in_stack_00000008 != 0)) {
    local_18 = 7;
  }
  else if (in_stack_00000010 == 0) {
    local_18 = 7;
  }
  else if (in_stack_00000018 == 0) {
    local_18 = 7;
  }
  else {
    local_48 = in_R9;
    local_40 = in_R8;
    local_38 = in_RCX;
    local_30 = in_RDX;
    local_7a._42_8_ =
         HandleManager::getSession
                   (in_stack_ffffffffffffff68,
                    CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    if ((CK_VOID_PTR)local_7a._42_8_ == (CK_VOID_PTR)0x0) {
      local_18 = 0xb3;
    }
    else {
      lVar1 = *local_30;
      if (lVar1 == 0) {
        local_7a._34_8_ = 0;
      }
      else if (lVar1 == 0x10) {
        local_7a._34_8_ = 1;
      }
      else if (lVar1 == 0x20) {
        local_7a._34_8_ = 2;
      }
      else if (lVar1 == 0x1040) {
        local_7a._34_8_ = 3;
      }
      else {
        if (lVar1 != 0x1055) {
          return 0x70;
        }
        local_7a._34_8_ = 0x40;
      }
      local_7a._18_8_ = 2;
      local_7a[0x11] = '\0';
      local_7a[0x10] = '\0';
      local_7a[0xf] = 1;
      extractObjectInformation
                (local_38,local_40,(CK_OBJECT_CLASS *)(local_7a + 0x12),
                 (CK_KEY_TYPE *)(local_7a + 0x22),(CK_CERTIFICATE_TYPE *)(local_7a + 0x1a),
                 local_7a + 0x11,local_7a + 0x10,true);
      if (local_7a._18_8_ == 2) {
        if ((*local_30 == 0) && (local_7a._34_8_ != 0)) {
          local_18 = 0xd1;
        }
        else if ((*local_30 == 0x10) && (local_7a._34_8_ != 1)) {
          local_18 = 0xd1;
        }
        else if ((*local_30 == 0x1040) && (local_7a._34_8_ != 3)) {
          local_18 = 0xd1;
        }
        else if ((*local_30 == 0x20) && (local_7a._34_8_ != 2)) {
          local_18 = 0xd1;
        }
        else if ((*local_30 == 0x1200) && (local_7a._34_8_ != 0x30)) {
          local_18 = 0xd1;
        }
        else if ((*local_30 == 0x1055) && (local_7a._34_8_ != 0x40)) {
          local_18 = 0xd1;
        }
        else {
          local_7a._2_8_ = 3;
          local_7a[1] = '\0';
          local_7a[0] = '\x01';
          this_00 = (Session *)local_7a;
          extractObjectInformation
                    (local_48,in_stack_00000008,(CK_OBJECT_CLASS *)(local_7a + 2),
                     (CK_KEY_TYPE *)(local_7a + 0x22),(CK_CERTIFICATE_TYPE *)(local_7a + 0x1a),
                     local_7a + 1,(CK_BBOOL *)this_00,true);
          if (local_7a._2_8_ == 3) {
            if ((*local_30 == 0) && (local_7a._34_8_ != 0)) {
              local_18 = 0xd1;
            }
            else if ((*local_30 == 0x10) && (local_7a._34_8_ != 1)) {
              local_18 = 0xd1;
            }
            else if ((*local_30 == 0x1040) && (local_7a._34_8_ != 3)) {
              local_18 = 0xd1;
            }
            else if ((*local_30 == 0x20) && (local_7a._34_8_ != 2)) {
              local_18 = 0xd1;
            }
            else if ((*local_30 == 0x1200) && (local_7a._34_8_ != 0x30)) {
              local_18 = 0xd1;
            }
            else if ((*local_30 == 0x1055) && (local_7a._34_8_ != 0x40)) {
              local_18 = 0xd1;
            }
            else {
              sessionState = Session::getState(this_00);
              local_a9 = local_7a[0x10] != '\0' || local_7a[0] != '\0';
              CVar2 = haveWrite(sessionState,local_7a[0x11] != '\0' || local_7a[1] != '\0',local_a9)
              ;
              if (CVar2 == 0) {
                if (*local_30 == 0) {
                  local_18 = generateRSA(in_stack_00001588,in_stack_00001580,in_stack_00001578,
                                         in_stack_00001570,in_stack_00001568,in_stack_00001560,
                                         in_stack_000015a0,in_stack_000015a8,in_stack_000015b0,
                                         in_stack_000015b8,in_stack_000015c0,in_stack_000015c8);
                }
                else if (*local_30 == 0x10) {
                  local_18 = generateDSA(in_stack_000011a8,in_stack_000011a0,in_stack_00001198,
                                         in_stack_00001190,in_stack_00001188,in_stack_00001180,
                                         in_stack_000011c0,in_stack_000011c8,in_stack_000011d0,
                                         in_stack_000011d8,in_stack_000011e0,in_stack_000011e8);
                }
                else if (*local_30 == 0x1040) {
                  local_18 = generateEC(in_stack_00000eb8,in_stack_00000eb0,in_stack_00000ea8,
                                        in_stack_00000ea0,in_stack_00000e98,in_stack_00000e90,
                                        in_stack_00000ed0,in_stack_00000ed8,in_stack_00000ee0,
                                        in_stack_00000ee8,in_stack_00000ef0,in_stack_00000ef8);
                }
                else if (*local_30 == 0x20) {
                  local_18 = generateDH(in_stack_00001118,in_stack_00001110,in_stack_00001108,
                                        in_stack_00001100,in_stack_000010f8,in_stack_000010f0,
                                        in_stack_00001130,in_stack_00001138,in_stack_00001140,
                                        in_stack_00001148,in_stack_00001150,in_stack_00001158);
                }
                else if (*local_30 == 0x1200) {
                  local_18 = generateGOST(in_stack_00001128,in_stack_00001120,
                                          (CK_ATTRIBUTE_PTR)in_stack_00001118,in_stack_00001110,
                                          in_stack_00001108,in_stack_00001100,
                                          (CK_OBJECT_HANDLE_PTR)
                                          CONCAT71(in_stack_00001141,in_stack_00001140),
                                          (CK_OBJECT_HANDLE_PTR)
                                          CONCAT71(in_stack_00001149,in_stack_00001148),
                                          in_stack_00001150,in_stack_00001158,in_stack_00001160,
                                          in_stack_00001168);
                }
                else if (*local_30 == 0x1055) {
                  local_18 = generateED(in_stack_00000eb8,in_stack_00000eb0,in_stack_00000ea8,
                                        in_stack_00000ea0,in_stack_00000e98,in_stack_00000e90,
                                        in_stack_00000ed0,in_stack_00000ed8,in_stack_00000ee0,
                                        in_stack_00000ee8,in_stack_00000ef0,in_stack_00000ef8);
                }
                else {
                  local_18 = 5;
                }
              }
              else {
                if (CVar2 == 0x101) {
                  softHSMLog(6,"C_GenerateKeyPair",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                             ,0x17dd,"User is not authorized");
                }
                local_18 = CVar2;
                if (CVar2 == 0xb5) {
                  softHSMLog(6,"C_GenerateKeyPair",
                             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                             ,0x17df,"Session is read-only");
                }
              }
            }
          }
          else {
            local_18 = 0x13;
          }
        }
      }
      else {
        local_18 = 0x13;
      }
    }
  }
  return local_18;
}

Assistant:

CK_RV SoftHSM::C_GenerateKeyPair
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pPublicKeyTemplate == NULL_PTR && ulPublicKeyAttributeCount != 0) return CKR_ARGUMENTS_BAD;
	if (pPrivateKeyTemplate == NULL_PTR && ulPrivateKeyAttributeCount != 0) return CKR_ARGUMENTS_BAD;
	if (phPublicKey == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phPrivateKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check the mechanism, only accept RSA, DSA, EC and DH key pair generation.
	CK_KEY_TYPE keyType;
	switch (pMechanism->mechanism)
	{
		case CKM_RSA_PKCS_KEY_PAIR_GEN:
			keyType = CKK_RSA;
			break;
		case CKM_DSA_KEY_PAIR_GEN:
			keyType = CKK_DSA;
			break;
		case CKM_DH_PKCS_KEY_PAIR_GEN:
			keyType = CKK_DH;
			break;
#ifdef WITH_ECC
		case CKM_EC_KEY_PAIR_GEN:
			keyType = CKK_EC;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410_KEY_PAIR_GEN:
			keyType = CKK_GOSTR3410;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EC_EDWARDS_KEY_PAIR_GEN:
			keyType = CKK_EC_EDWARDS;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}
	CK_CERTIFICATE_TYPE dummy;

	// Extract information from the public key template that is needed to create the object.
	CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
	CK_BBOOL ispublicKeyToken = CK_FALSE;
	CK_BBOOL ispublicKeyPrivate = CK_FALSE;
	bool isPublicKeyImplicit = true;
	extractObjectInformation(pPublicKeyTemplate, ulPublicKeyAttributeCount, publicKeyClass, keyType, dummy, ispublicKeyToken, ispublicKeyPrivate, isPublicKeyImplicit);

	// Report errors caused by accidental template mix-ups in the application using this cryptoki lib.
	if (publicKeyClass != CKO_PUBLIC_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	if (pMechanism->mechanism == CKM_RSA_PKCS_KEY_PAIR_GEN && keyType != CKK_RSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DSA_KEY_PAIR_GEN && keyType != CKK_DSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_KEY_PAIR_GEN && keyType != CKK_EC)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DH_PKCS_KEY_PAIR_GEN && keyType != CKK_DH)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_GOSTR3410_KEY_PAIR_GEN && keyType != CKK_GOSTR3410)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_EDWARDS_KEY_PAIR_GEN && keyType != CKK_EC_EDWARDS)
		return CKR_TEMPLATE_INCONSISTENT;

	// Extract information from the private key template that is needed to create the object.
	CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
	CK_BBOOL isprivateKeyToken = CK_FALSE;
	CK_BBOOL isprivateKeyPrivate = CK_TRUE;
	bool isPrivateKeyImplicit = true;
	extractObjectInformation(pPrivateKeyTemplate, ulPrivateKeyAttributeCount, privateKeyClass, keyType, dummy, isprivateKeyToken, isprivateKeyPrivate, isPrivateKeyImplicit);

	// Report errors caused by accidental template mix-ups in the application using this cryptoki lib.
	if (privateKeyClass != CKO_PRIVATE_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	if (pMechanism->mechanism == CKM_RSA_PKCS_KEY_PAIR_GEN && keyType != CKK_RSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DSA_KEY_PAIR_GEN && keyType != CKK_DSA)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_KEY_PAIR_GEN && keyType != CKK_EC)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DH_PKCS_KEY_PAIR_GEN && keyType != CKK_DH)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_GOSTR3410_KEY_PAIR_GEN && keyType != CKK_GOSTR3410)
		return CKR_TEMPLATE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_EC_EDWARDS_KEY_PAIR_GEN && keyType != CKK_EC_EDWARDS)
		return CKR_TEMPLATE_INCONSISTENT;

	// Check user credentials
	CK_RV rv = haveWrite(session->getState(), ispublicKeyToken || isprivateKeyToken, ispublicKeyPrivate || isprivateKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Generate RSA keys
	if (pMechanism->mechanism == CKM_RSA_PKCS_KEY_PAIR_GEN)
	{
			return this->generateRSA(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate DSA keys
	if (pMechanism->mechanism == CKM_DSA_KEY_PAIR_GEN)
	{
			return this->generateDSA(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate EC keys
	if (pMechanism->mechanism == CKM_EC_KEY_PAIR_GEN)
	{
			return this->generateEC(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate DH keys
	if (pMechanism->mechanism == CKM_DH_PKCS_KEY_PAIR_GEN)
	{
			return this->generateDH(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate GOST keys
	if (pMechanism->mechanism == CKM_GOSTR3410_KEY_PAIR_GEN)
	{
			return this->generateGOST(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	// Generate EDDSA keys
	if (pMechanism->mechanism == CKM_EC_EDWARDS_KEY_PAIR_GEN)
	{
			return this->generateED(hSession,
									 pPublicKeyTemplate, ulPublicKeyAttributeCount,
									 pPrivateKeyTemplate, ulPrivateKeyAttributeCount,
									 phPublicKey, phPrivateKey,
									 ispublicKeyToken, ispublicKeyPrivate, isprivateKeyToken, isprivateKeyPrivate);
	}

	return CKR_GENERAL_ERROR;
}